

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O1

bool __thiscall testing::internal::MatchMatrix::NextGraph(MatchMatrix *this)

{
  ulong uVar1;
  long lVar2;
  ulong uVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  
  bVar4 = *(long *)this != 0;
  if (bVar4) {
    uVar1 = 0;
    do {
      bVar5 = *(long *)(this + 8) != 0;
      if (bVar5) {
        lVar2 = *(long *)(this + 8) * uVar1;
        bVar6 = *(char *)(*(long *)(this + 0x10) + lVar2) == '\0';
        *(bool *)(*(long *)(this + 0x10) + lVar2) = bVar6;
        if (!bVar6) {
          uVar3 = 1;
          do {
            bVar5 = uVar3 < *(ulong *)(this + 8);
            if (!bVar5) goto LAB_00142152;
            lVar2 = *(ulong *)(this + 8) * uVar1 + *(long *)(this + 0x10);
            bVar6 = *(char *)(uVar3 + lVar2) == '\0';
            *(bool *)(uVar3 + lVar2) = bVar6;
            uVar3 = uVar3 + 1;
          } while (!bVar6);
        }
        if (bVar5) {
          return bVar4;
        }
      }
LAB_00142152:
      uVar1 = uVar1 + 1;
      bVar4 = uVar1 < *(ulong *)this;
    } while (bVar4);
  }
  return bVar4;
}

Assistant:

bool MatchMatrix::NextGraph() {
  for (size_t ilhs = 0; ilhs < LhsSize(); ++ilhs) {
    for (size_t irhs = 0; irhs < RhsSize(); ++irhs) {
      char& b = matched_[SpaceIndex(ilhs, irhs)];
      if (!b) {
        b = 1;
        return true;
      }
      b = 0;
    }
  }
  return false;
}